

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O2

void __thiscall
PrintfTest_VSPrintfMakeArgsExample_Test::TestBody(PrintfTest_VSPrintfMakeArgsExample_Test *this)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
  __return_storage_ptr__;
  char *message;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args_00;
  AssertionResult gtest_ar_1;
  AssertHelper local_80;
  AssertionResult gtest_ar;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int,_char[10]>
  as2;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int,_const_char_*>
  as;
  
  as.data_[0].field_0.long_long_value = 0x2a;
  as.data_[1].field_0.double_value = (double)anon_var_dwarf_f7f4;
  __return_storage_ptr__.values_ = as2.data_;
  args.field_1.values_ = in_R8.values_;
  args.types_ = (unsigned_long_long)&as;
  fmt::v5::vsprintf<char[17],char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__.values_,(v5 *)"[%d] %s happened",
             fmt::v5::
             format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int,char_const*>
             ::TYPES,args);
  testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"[42] something happened\"",
             "fmt::vsprintf(\"[%d] %s happened\", args)",(char (*) [24])"[42] something happened",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__.values_);
  std::__cxx11::string::~string((string *)&as2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&as2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      __return_storage_ptr__.values_ =
           (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
            *)0x19eeb0;
    }
    else {
      __return_storage_ptr__ =
           (anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
            )((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x219,(char *)__return_storage_ptr__.values_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&as2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&as2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  as2.data_[0].field_0.long_long_value = 0x2a;
  as2.data_[1].field_0.double_value = (double)anon_var_dwarf_f7f4;
  args_00.field_1.values_ = __return_storage_ptr__.values_;
  args_00.types_ = (unsigned_long_long)&as2;
  fmt::v5::vsprintf<char[17],char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"[%d] %s happened",
             fmt::v5::
             format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int,char[10]>
             ::TYPES,args_00);
  testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"[42] something happened\"",
             "fmt::vsprintf(\"[%d] %s happened\", args2)",(char (*) [24])"[42] something happened",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x21d,message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  return;
}

Assistant:

TEST(PrintfTest, VSPrintfMakeArgsExample) {
  fmt::format_arg_store<fmt::printf_context, int, const char *> as{
      42, "something"};
  fmt::basic_format_args<fmt::printf_context> args(as);
  EXPECT_EQ(
      "[42] something happened", fmt::vsprintf("[%d] %s happened", args));
  auto as2 = fmt::make_printf_args(42, "something");
  fmt::basic_format_args<fmt::printf_context> args2(as2);
  EXPECT_EQ(
      "[42] something happened", fmt::vsprintf("[%d] %s happened", args2));
  //the older gcc versions can't cast the return value
#if !defined(__GNUC__) || (__GNUC__ > 4) 
  EXPECT_EQ(
      "[42] something happened",
      fmt::vsprintf(
          "[%d] %s happened", fmt::make_printf_args(42, "something")));
#endif
}